

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O2

int64_t __thiscall BamTools::Internal::BamFtp::Write(BamFtp *this,char *data,uint numBytes)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"BamFtp::Write",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,"write-mode not supported on this device",&local_4a);
  IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return -1;
}

Assistant:

int64_t BamFtp::Write(const char* data, const unsigned int numBytes) {
    (void)data;
    (void)numBytes;
    BT_ASSERT_X(false, "BamFtp::Write : write-mode not supported on this device");
    SetErrorString("BamFtp::Write", "write-mode not supported on this device");
    return -1;
}